

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_neon_mull(TCGContext_conflict1 *tcg_ctx,TCGv_i64 dest,TCGv_i32 a,TCGv_i32 b,int size,int u)

{
  TCGTemp *a2;
  uintptr_t o_1;
  TCGv_i32 rh;
  code *func;
  TCGv_i64 dest_00;
  uintptr_t o_2;
  uintptr_t o;
  TCGv_i32 local_68;
  TCGTemp *local_60;
  TCGTemp *local_58;
  TCGTemp *local_48;
  TCGv_i32 local_40;
  
  switch(size * 2 | u) {
  case 0:
    func = helper_neon_mull_s8_aarch64;
    break;
  case 1:
    func = helper_neon_mull_u8_aarch64;
    break;
  case 2:
    func = helper_neon_mull_s16_aarch64;
    break;
  case 3:
    func = helper_neon_mull_u16_aarch64;
    break;
  case 4:
    local_58 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
    local_68 = (TCGv_i32)((long)local_58 - (long)tcg_ctx);
    local_60 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
    rh = (TCGv_i32)((long)local_60 - (long)tcg_ctx);
    tcg_gen_muls2_i32_aarch64(tcg_ctx,local_68,rh,a,b);
    goto LAB_00656197;
  case 5:
    local_58 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
    local_68 = (TCGv_i32)((long)local_58 - (long)tcg_ctx);
    local_60 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
    rh = (TCGv_i32)((long)local_60 - (long)tcg_ctx);
    tcg_gen_mulu2_i32_aarch64(tcg_ctx,local_68,rh,a,b);
LAB_00656197:
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(a + (long)&tcg_ctx->pool_cur));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(b + (long)&tcg_ctx->pool_cur));
    a2 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    dest_00 = (TCGv_i64)((long)a2 - (long)tcg_ctx);
    tcg_gen_concat_i32_i64_aarch64(tcg_ctx,dest_00,local_68,rh);
    tcg_temp_free_internal_aarch64(tcg_ctx,local_58);
    tcg_temp_free_internal_aarch64(tcg_ctx,local_60);
    if (dest_00 != dest) {
      tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(dest + (long)tcg_ctx),(TCGArg)a2);
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(dest_00 + (long)tcg_ctx));
    goto LAB_00656226;
  default:
    abort();
  }
  local_40 = b + (long)&tcg_ctx->pool_cur;
  local_48 = (TCGTemp *)(a + (long)&tcg_ctx->pool_cur);
  tcg_gen_callN_aarch64(tcg_ctx,func,(TCGTemp *)(dest + (long)tcg_ctx),2,&local_48);
LAB_00656226:
  if (size < 2) {
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(a + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(b + (long)tcg_ctx));
  }
  return;
}

Assistant:

static inline void gen_neon_mull(TCGContext *tcg_ctx, TCGv_i64 dest, TCGv_i32 a, TCGv_i32 b,
                                 int size, int u)
{
    TCGv_i64 tmp;

    switch ((size << 1) | u) {
    case 0: gen_helper_neon_mull_s8(tcg_ctx, dest, a, b); break;
    case 1: gen_helper_neon_mull_u8(tcg_ctx, dest, a, b); break;
    case 2: gen_helper_neon_mull_s16(tcg_ctx, dest, a, b); break;
    case 3: gen_helper_neon_mull_u16(tcg_ctx, dest, a, b); break;
    case 4:
        tmp = gen_muls_i64_i32(tcg_ctx, a, b);
        tcg_gen_mov_i64(tcg_ctx, dest, tmp);
        tcg_temp_free_i64(tcg_ctx, tmp);
        break;
    case 5:
        tmp = gen_mulu_i64_i32(tcg_ctx, a, b);
        tcg_gen_mov_i64(tcg_ctx, dest, tmp);
        tcg_temp_free_i64(tcg_ctx, tmp);
        break;
    default: abort();
    }

    /* gen_helper_neon_mull_[su]{8|16} do not free their parameters.
       Don't forget to clean them now.  */
    if (size < 2) {
        tcg_temp_free_i32(tcg_ctx, a);
        tcg_temp_free_i32(tcg_ctx, b);
    }
}